

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2furthest_edge_query.cc
# Opt level: O0

void __thiscall
S2FurthestEdgeQuery::FindFurthestEdges
          (S2FurthestEdgeQuery *this,Target *target,
          vector<S2FurthestEdgeQuery::Result,_std::allocator<S2FurthestEdgeQuery::Result>_> *results
          )

{
  bool bVar1;
  reference pRVar2;
  Result local_78;
  undefined1 auStack_68 [8];
  Result result;
  __normal_iterator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result_*,_std::vector<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>_>_>
  local_50;
  iterator __end1;
  iterator __begin1;
  vector<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>_>
  *__range1;
  vector<S2FurthestEdgeQuery::Result,_std::allocator<S2FurthestEdgeQuery::Result>_> *results_local;
  Target *target_local;
  S2FurthestEdgeQuery *this_local;
  
  std::vector<S2FurthestEdgeQuery::Result,_std::allocator<S2FurthestEdgeQuery::Result>_>::clear
            (results);
  S2ClosestEdgeQueryBase<S2MaxDistance>::FindClosestEdges
            ((vector<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>_>
              *)&__begin1,&this->base_,target,(Options *)this);
  __end1 = std::
           vector<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>_>
           ::begin((vector<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>_>
                    *)&__begin1);
  local_50._M_current =
       (Result *)
       std::
       vector<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>_>
       ::end((vector<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>_>
              *)&__begin1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&local_50);
    if (!bVar1) break;
    pRVar2 = __gnu_cxx::
             __normal_iterator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result_*,_std::vector<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>_>_>
             ::operator*(&__end1);
    auStack_68 = (undefined1  [8])(pRVar2->distance_).distance_.length2_;
    result.distance_.distance_.length2_ = *(S1ChordAngle *)&pRVar2->shape_id_;
    Result::Result(&local_78,(Result *)auStack_68);
    std::vector<S2FurthestEdgeQuery::Result,_std::allocator<S2FurthestEdgeQuery::Result>_>::
    push_back(results,&local_78);
    __gnu_cxx::
    __normal_iterator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result_*,_std::vector<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>_>
  ::~vector((vector<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>_>
             *)&__begin1);
  return;
}

Assistant:

void S2FurthestEdgeQuery::FindFurthestEdges(
    Target* target, std::vector<S2FurthestEdgeQuery::Result>* results) {
  results->clear();
  for (auto result : base_.FindClosestEdges(target, options_)) {
    results->push_back(S2FurthestEdgeQuery::Result(result));
  }
}